

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O2

void tcmalloc::Log(int mode,char *filename,int line,undefined4 param_4)

{
  char *pcVar1;
  char **msg;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  undefined1 local_120 [8];
  Logger state;
  LogItem a_local;
  
  msg = &state.end_;
  pcVar1 = state.buf_ + 0xc0;
  local_120 = (undefined1  [8])msg;
  state.p_ = pcVar1;
  state.buf_._192_4_ = param_4;
  sVar4 = strlen(filename);
  sVar4 = (size_t)(int)sVar4;
  if ((long)sVar4 < 0xc9) {
    memcpy(msg,filename,sVar4);
    local_120 = (undefined1  [8])(sVar4 + (long)msg);
    if ((undefined1  [8])pcVar1 != local_120 && -1 < (long)pcVar1 - (long)local_120) {
      *(undefined1 *)local_120 = 0x3a;
      local_120 = (undefined1  [8])(state.buf_ + (sVar4 - 7));
      bVar3 = Logger::AddNum((Logger *)local_120,(long)line,10);
      if ((bVar3) &&
         ((undefined1  [8])state.p_ != local_120 && -1 < (long)state.p_ - (long)local_120)) {
        *(undefined1 *)local_120 = 0x5d;
        local_120 = (undefined1  [8])((long)local_120 + 1);
        bVar3 = Logger::Add((Logger *)local_120,(LogItem *)(state.buf_ + 0xc0));
        if (bVar3) {
          bVar3 = Logger::Add((Logger *)local_120,(LogItem *)&stack0x00000008);
          if (bVar3) {
            bVar3 = Logger::Add((Logger *)local_120,(LogItem *)&stack0x00000018);
            if (bVar3) {
              Logger::Add((Logger *)local_120,(LogItem *)&stack0x00000028);
            }
          }
        }
      }
    }
  }
  if (state.p_ <= (ulong)local_120) {
    local_120 = (undefined1  [8])(state.p_ + -1);
  }
  *(undefined1 *)local_120 = 10;
  local_120 = (undefined1  [8])((long)local_120 + 1);
  WriteMessage((char *)msg,SUB84(local_120,0) - (int)msg);
  if (mode == 0) {
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void Log(LogMode mode, const char* filename, int line,
         LogItem a, LogItem b, LogItem c, LogItem d) {
  Logger state;
  state.p_ = state.buf_;
  state.end_ = state.buf_ + sizeof(state.buf_);
  state.AddStr(filename, strlen(filename))
      && state.AddStr(":", 1)
      && state.AddNum(line, 10)
      && state.AddStr("]", 1)
      && state.Add(a)
      && state.Add(b)
      && state.Add(c)
      && state.Add(d);

  // Teminate with newline
  if (state.p_ >= state.end_) {
    state.p_ = state.end_ - 1;
  }
  *state.p_ = '\n';
  state.p_++;

  int msglen = state.p_ - state.buf_;
  if (mode == kLog) {
    WriteMessage(state.buf_, msglen);
    return;
  }

  WriteMessage(state.buf_, msglen);

#if defined(__has_builtin)
#if __has_builtin(__builtin_trap)
  __builtin_trap();
#endif
#endif  // defined(__has_builtin)

  abort();
}